

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int set_directory_record
              (uchar *p,size_t n,isoent *isoent,iso9660_conflict *iso9660,dir_rec_type t,
              vdd_type vdd_type)

{
  long in_RCX;
  uchar *in_RDX;
  ulong in_RSI;
  uchar *in_RDI;
  uint in_R8D;
  int in_R9D;
  uchar flag;
  isofile *file;
  isoent *xisoent;
  size_t fi_len;
  size_t dr_len;
  uchar *bp;
  isoent *in_stack_00000080;
  int in_stack_0000008c;
  uchar *in_stack_00000090;
  uint32_t in_stack_ffffffffffffff7c;
  uint16_t value;
  uchar *in_stack_ffffffffffffff80;
  uchar local_59;
  long t_00;
  uchar *p_00;
  size_t local_48;
  ulong local_40;
  uchar *local_38;
  int local_4;
  
  if (in_RDI != (uchar *)0x0) {
    switch(in_R8D) {
    case 0:
      local_40 = (ulong)*(int *)(in_RDX + 0x8c);
      break;
    case 1:
      local_40 = (ulong)*(int *)(in_RDX + 0x90);
      break;
    case 2:
      local_40 = (ulong)*(int *)(in_RDX + 0x94);
      break;
    case 3:
    default:
      local_40 = (ulong)*(int *)(in_RDX + 0x98);
    }
    if (in_RSI < local_40) {
      return 0;
    }
  }
  if ((in_R8D == 3) && (*(long *)(in_RDX + 0xa8) != 0)) {
    local_48 = (size_t)*(int *)(in_RDX + 0xb8);
  }
  else {
    local_48 = 1;
  }
  if (in_RDI == (uchar *)0x0) {
    local_38 = (uchar *)0x0;
  }
  else {
    p_00 = in_RDX;
    if (in_R8D == 2) {
      p_00 = *(uchar **)(in_RDX + 0x20);
    }
    t_00 = *(long *)(in_RDX + 0x18);
    if (*(long *)(t_00 + 0x18) != 0) {
      t_00 = *(long *)(t_00 + 0x18);
    }
    if ((char)(p_00[0xe8] << 6) < '\0') {
      local_59 = '\x02';
    }
    else if (*(long *)(*(long *)(t_00 + 0xb0) + 0x18) == 0) {
      local_59 = '\0';
    }
    else {
      local_59 = 0x80;
    }
    local_38 = in_RDI + -1;
    set_num_711(in_RDI + 1,'\0');
    if ((char)(p_00[0xe8] << 6) < '\0') {
      set_num_733(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
    else {
      set_num_733(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
    if ((char)(p_00[0xe8] << 6) < '\0') {
      set_num_733(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      value = (uint16_t)(in_stack_ffffffffffffff7c >> 0x10);
    }
    else {
      set_num_733(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      value = (uint16_t)(in_stack_ffffffffffffff7c >> 0x10);
    }
    archive_entry_mtime(*(archive_entry **)(*(long *)(p_00 + 0x18) + 0x20));
    set_time_915(p_00,t_00);
    in_RDI[0x19] = local_59;
    set_num_711(in_RDI + 0x1a,'\0');
    set_num_711(in_RDI + 0x1b,'\0');
    set_num_723(in_stack_ffffffffffffff80,value);
    set_num_711(in_RDI + 0x20,(uchar)local_48);
    if (in_R8D < 2) {
      set_num_711(in_RDI + 0x21,'\0');
    }
    else if (in_R8D == 2) {
      set_num_711(in_RDI + 0x21,'\x01');
    }
    else if (in_R8D == 3) {
      if (*(long *)(in_RDX + 0xa8) == 0) {
        set_num_711(in_RDI + 0x21,'\0');
      }
      else {
        memcpy(in_RDI + 0x21,*(void **)(in_RDX + 0xa8),local_48);
      }
    }
  }
  local_40 = local_48 + 0x21;
  if (((local_40 & 1) != 0) && (local_40 = local_48 + 0x22, in_RDI != (uchar *)0x0)) {
    local_38[local_40] = '\0';
  }
  if (in_R8D == 0) {
    local_4 = (int)local_40;
    if (in_RDI == (uchar *)0x0) {
      *(int *)(in_RDX + 0x8c) = (int)local_40;
    }
    else {
      set_num_711(in_RDI,(uchar)local_40);
    }
  }
  else {
    if (((*(uint *)(in_RCX + 0x10370) >> 0x17 & 3) != 0) && (in_R9D != 1)) {
      local_40._0_4_ =
           set_directory_record_rr
                     (in_stack_00000090,in_stack_0000008c,in_stack_00000080,(iso9660_conflict *)p,
                      n._4_4_);
    }
    local_4 = (int)local_40;
    if (in_RDI == (uchar *)0x0) {
      switch(in_R8D) {
      case 0:
        break;
      case 1:
        *(int *)(in_RDX + 0x90) = (int)local_40;
        break;
      case 2:
        *(int *)(in_RDX + 0x94) = (int)local_40;
        break;
      case 3:
        *(int *)(in_RDX + 0x98) = (int)local_40;
      }
    }
    else {
      set_num_711(in_RDI,(uchar)(int)local_40);
    }
  }
  return local_4;
}

Assistant:

static int
set_directory_record(unsigned char *p, size_t n, struct isoent *isoent,
    struct iso9660 *iso9660, enum dir_rec_type t,
    enum vdd_type vdd_type)
{
	unsigned char *bp;
	size_t dr_len;
	size_t fi_len;

	if (p != NULL) {
		/*
		 * Check whether a write buffer size is less than the
		 * saved size which is needed to write this Directory
		 * Record.
		 */
		switch (t) {
		case DIR_REC_VD:
			dr_len = isoent->dr_len.vd; break;
		case DIR_REC_SELF:
			dr_len = isoent->dr_len.self; break;
		case DIR_REC_PARENT:
			dr_len = isoent->dr_len.parent; break;
		case DIR_REC_NORMAL:
		default:
			dr_len = isoent->dr_len.normal; break;
		}
		if (dr_len > n)
			return (0);/* Needs more buffer size. */
	}

	if (t == DIR_REC_NORMAL && isoent->identifier != NULL)
		fi_len = isoent->id_len;
	else
		fi_len = 1;

	if (p != NULL) {
		struct isoent *xisoent;
		struct isofile *file;
		unsigned char flag;

		if (t == DIR_REC_PARENT)
			xisoent = isoent->parent;
		else
			xisoent = isoent;
		file = isoent->file;
		if (file->hardlink_target != NULL)
			file = file->hardlink_target;
		/* Make a file flag. */
		if (xisoent->dir)
			flag = FILE_FLAG_DIRECTORY;
		else {
			if (file->cur_content->next != NULL)
				flag = FILE_FLAG_MULTI_EXTENT;
			else
				flag = 0;
		}

		bp = p -1;
		/* Extended Attribute Record Length */
		set_num_711(bp+2, 0);
		/* Location of Extent */
		if (xisoent->dir)
			set_num_733(bp+3, xisoent->dir_location);
		else
			set_num_733(bp+3, file->cur_content->location);
		/* Data Length */
		if (xisoent->dir)
			set_num_733(bp+11,
			    xisoent->dir_block * LOGICAL_BLOCK_SIZE);
		else
			set_num_733(bp+11, (uint32_t)file->cur_content->size);
		/* Recording Date and Time */
		/* NOTE:
		 *  If a file type is symbolic link, you are seeing this
		 *  field value is different from a value mkisofs makes.
		 *  libarchive uses lstat to get this one, but it
		 *  seems mkisofs uses stat to get.
		 */
		set_time_915(bp+19,
		    archive_entry_mtime(xisoent->file->entry));
		/* File Flags */
		bp[26] = flag;
		/* File Unit Size */
		set_num_711(bp+27, 0);
		/* Interleave Gap Size */
		set_num_711(bp+28, 0);
		/* Volume Sequence Number */
		set_num_723(bp+29, iso9660->volume_sequence_number);
		/* Length of File Identifier */
		set_num_711(bp+33, (unsigned char)fi_len);
		/* File Identifier */
		switch (t) {
		case DIR_REC_VD:
		case DIR_REC_SELF:
			set_num_711(bp+34, 0);
			break;
		case DIR_REC_PARENT:
			set_num_711(bp+34, 1);
			break;
		case DIR_REC_NORMAL:
			if (isoent->identifier != NULL)
				memcpy(bp+34, isoent->identifier, fi_len);
			else
				set_num_711(bp+34, 0);
			break;
		}
	} else
		bp = NULL;
	dr_len = 33 + fi_len;
	/* Padding Field */
	if (dr_len & 0x01) {
		dr_len ++;
		if (p != NULL)
			bp[dr_len] = 0;
	}

	/* Volume Descriptor does not record extension. */
	if (t == DIR_REC_VD) {
		if (p != NULL)
			/* Length of Directory Record */
			set_num_711(p, (unsigned char)dr_len);
		else
			isoent->dr_len.vd = (int)dr_len;
		return ((int)dr_len);
	}

	/* Rockridge */
	if (iso9660->opt.rr && vdd_type != VDD_JOLIET)
		dr_len = set_directory_record_rr(bp, (int)dr_len,
		    isoent, iso9660, t);

	if (p != NULL)
		/* Length of Directory Record */
		set_num_711(p, (unsigned char)dr_len);
	else {
		/*
		 * Save the size which is needed to write this
		 * Directory Record.
		 */
		switch (t) {
		case DIR_REC_VD:
			/* This case does not come, but compiler
			 * complains that DIR_REC_VD not handled
			 *  in switch ....  */
			break;
		case DIR_REC_SELF:
			isoent->dr_len.self = (int)dr_len; break;
		case DIR_REC_PARENT:
			isoent->dr_len.parent = (int)dr_len; break;
		case DIR_REC_NORMAL:
			isoent->dr_len.normal = (int)dr_len; break;
		}
	}

	return ((int)dr_len);
}